

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::CollapseFullPath
                   (string *__return_storage_ptr__,string *in_path,char *in_base)

{
  char *pcVar1;
  char buf [2048];
  allocator<char> local_839;
  string local_838;
  char local_818 [2048];
  
  if (in_base == (char *)0x0) {
    pcVar1 = getcwd(local_818,0x800);
    in_base = "";
    if (pcVar1 != (char *)0x0) {
      in_base = pcVar1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,in_base,&local_839);
  CollapseFullPath(__return_storage_ptr__,in_path,&local_838);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::CollapseFullPath(const std::string& in_path,
                                          const char* in_base)
{
  // Use the current working directory as a base path.
  char buf[2048];
  const char* res_in_base = in_base;
  if (!res_in_base) {
    if (const char* cwd = Getcwd(buf, 2048)) {
      res_in_base = cwd;
    } else {
      res_in_base = "";
    }
  }

  return SystemTools::CollapseFullPath(in_path, std::string(res_in_base));
}